

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hunk.cpp
# Opt level: O3

void __thiscall Hunk::flushContext(Hunk *this)

{
  HtmlDivs *this_00;
  bool bVar1;
  int in_ESI;
  QByteArrayView QVar2;
  QString local_60;
  QArrayDataPointer<QString> local_48;
  QArrayData *local_30;
  undefined8 *local_28;
  
  this_00 = &this->mContext;
  bVar1 = HtmlDivs::isEmpty(this_00);
  if (!bVar1) {
    HtmlDivs::close(this_00,in_ESI);
    HtmlDivs::divs(this_00);
    QVar2.m_data = (storage_type *)0x0;
    QVar2.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar2);
    if (local_28 == (undefined8 *)0x0) {
      local_28 = &QString::_empty;
    }
    QtPrivate::QStringList_join((QList *)&local_60,(QChar *)&local_48,(longlong)local_28);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&this->mLines,(this->mLines).d.size,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_30 != (QArrayData *)0x0) {
      LOCK();
      (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30,2,8);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    HtmlDivs::clear(this_00);
  }
  return;
}

Assistant:

void Hunk::flushContext() {
    if (mContext.isEmpty()) {
        return;
    }
    mContext.close();
    mLines << mContext.divs().join("");
    mContext.clear();
}